

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O2

void * err_unwind(lua_State *L,void *stopcf,int errcode)

{
  byte *pbVar1;
  int iVar2;
  void *pvVar3;
  code *pcVar4;
  uint uVar5;
  TValue *top;
  TValue *pTVar6;
  ulong uVar7;
  void **ppvVar8;
  TValue *pTVar9;
  TValue *pTVar10;
  
  pTVar9 = L->base + -1;
  ppvVar8 = &L->cframe;
LAB_001129f3:
  pvVar3 = *ppvVar8;
LAB_001129fd:
  if (pvVar3 == (void *)0x0) {
LAB_00112a8e:
    if (errcode != 0) {
      pTVar9 = (TValue *)((ulong)(L->stack).ptr32 + 8);
      L->base = pTVar9;
      L->cframe = (void *)0x0;
      unwindstack(L,pTVar9);
      pcVar4 = *(code **)((ulong)(L->glref).ptr32 + 0x178);
      if (pcVar4 != (code *)0x0) {
        (*pcVar4)(L);
      }
      exit(1);
    }
    return L;
  }
  iVar2 = *(int *)(((ulong)pvVar3 & 0xfffffffffffffffc) + 0x10);
  pTVar10 = (TValue *)(ulong)(L->stack).ptr32;
  if ((iVar2 < 0) && (pTVar6 = (TValue *)((ulong)(uint)-iVar2 + (long)pTVar10), pTVar9 < pTVar6)) {
    if (errcode == 0) {
      return pvVar3;
    }
    L->base = pTVar9 + 1;
    L->cframe = *(void **)((long)pvVar3 + 0x30);
    pTVar9 = pTVar6;
LAB_00112ab5:
    unwindstack(L,pTVar9);
    return pvVar3;
  }
  if (pTVar9 <= pTVar10) goto LAB_00112a8e;
  uVar5 = (pTVar9->field_2).it;
  switch(uVar5 & 7) {
  default:
    pTVar9 = pTVar9 + (-1 - (ulong)*(byte *)((ulong)uVar5 - 3));
    goto LAB_001129fd;
  case 1:
    goto switchD_00112a36_caseD_1;
  case 2:
    if (pTVar9[-1].u32.lo == 1) goto switchD_00112a36_caseD_1;
switchD_00112a36_caseD_3:
    pTVar9 = (TValue *)((long)pTVar9 - ((long)(int)uVar5 & 0xfffffffffffffff8U));
    goto LAB_001129fd;
  case 3:
    goto switchD_00112a36_caseD_3;
  case 5:
    if (((ulong)pvVar3 & 1) != 0) {
      if (errcode != 0) {
        pbVar1 = (byte *)((ulong)(L->glref).ptr32 + 0x109);
        *pbVar1 = *pbVar1 & 0xef;
        L->cframe = (void *)0x0;
        L->status = (uint8_t)errcode;
        return pvVar3;
      }
      return pvVar3;
    }
    if (errcode == 0) {
      return pvVar3;
    }
    L->base = (TValue *)((long)pTVar9 + (8 - ((long)(int)uVar5 & 0xfffffffffffffff8U)));
    L->cframe = *(void **)((long)pvVar3 + 0x30);
    goto LAB_00112ab5;
  case 6:
  case 7:
    break;
  }
  if (errcode != 1) {
    if (errcode != 0) {
      uVar7 = (ulong)(L->glref).ptr32;
      *(int *)(uVar7 + 0x188) = (int)L;
      uVar5 = (pTVar9->field_2).it;
      if ((uVar5 & 7) == 6) {
        pbVar1 = (byte *)(uVar7 + 0x109);
        *pbVar1 = *pbVar1 & 0xef;
        uVar5 = (pTVar9->field_2).it;
      }
      pTVar9 = (TValue *)((long)pTVar9 + (8 - (long)(int)(uVar5 & 0xfffffff8)));
      L->base = pTVar9;
      L->cframe = pvVar3;
      unwindstack(L,pTVar9);
    }
    return (void *)((ulong)pvVar3 | 2);
  }
  pTVar9 = (TValue *)((long)pTVar9 - (long)(int)(uVar5 & 0xfffffff8));
  goto LAB_001129fd;
switchD_00112a36_caseD_1:
  if (errcode != 0) {
    L->base = (TValue *)((long)pTVar9 + (8 - (long)(int)(uVar5 & 0xfffffff8)));
    L->cframe = *(void **)((long)pvVar3 + 0x30);
    unwindstack(L,pTVar9);
    return (void *)0x0;
  }
  if (pvVar3 == stopcf) {
    return (void *)0x0;
  }
  ppvVar8 = (void **)((long)pvVar3 + 0x30);
  pTVar9 = (TValue *)((long)pTVar9 - (long)(int)(uVar5 & 0xfffffff8));
  goto LAB_001129f3;
}

Assistant:

static void *err_unwind(lua_State *L, void *stopcf, int errcode)
{
  TValue *frame = L->base-1;
  void *cf = L->cframe;
  while (cf) {
    int32_t nres = cframe_nres(cframe_raw(cf));
    if (nres < 0) {  /* C frame without Lua frame? */
      TValue *top = restorestack(L, -nres);
      if (frame < top) {  /* Frame reached? */
	if (errcode) {
	  L->base = frame+1;
	  L->cframe = cframe_prev(cf);
	  unwindstack(L, top);
	}
	return cf;
      }
    }
    if (frame <= tvref(L->stack)+LJ_FR2)
      break;
    switch (frame_typep(frame)) {
    case FRAME_LUA:  /* Lua frame. */
    case FRAME_LUAP:
      frame = frame_prevl(frame);
      break;
    case FRAME_C:  /* C frame. */
    unwind_c:
#if LJ_UNWIND_EXT
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      } else if (cf != stopcf) {
	cf = cframe_prev(cf);
	frame = frame_prevd(frame);
	break;
      }
      return NULL;  /* Continue unwinding. */
#else
      UNUSED(stopcf);
      cf = cframe_prev(cf);
      frame = frame_prevd(frame);
      break;
#endif
    case FRAME_CP:  /* Protected C frame. */
      if (cframe_canyield(cf)) {  /* Resume? */
	if (errcode) {
	  hook_leave(G(L));  /* Assumes nobody uses coroutines inside hooks. */
	  L->cframe = NULL;
	  L->status = (uint8_t)errcode;
	}
	return cf;
      }
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      }
      return cf;
    case FRAME_CONT:  /* Continuation frame. */
      if (frame_iscont_fficb(frame))
	goto unwind_c;
      /* fallthrough */
    case FRAME_VARG:  /* Vararg frame. */
      frame = frame_prevd(frame);
      break;
    case FRAME_PCALL:  /* FF pcall() frame. */
    case FRAME_PCALLH:  /* FF pcall() frame inside hook. */
      if (errcode) {
	global_State *g;
	if (errcode == LUA_YIELD) {
	  frame = frame_prevd(frame);
	  break;
	}
	g = G(L);
	setgcref(g->cur_L, obj2gco(L));
	if (frame_typep(frame) == FRAME_PCALL)
	  hook_leave(g);
	L->base = frame_prevd(frame) + 1;
	L->cframe = cf;
	unwindstack(L, L->base);
      }
      return (void *)((intptr_t)cf | CFRAME_UNWIND_FF);
    }
  }
  /* No C frame. */
  if (errcode) {
    L->base = tvref(L->stack)+1+LJ_FR2;
    L->cframe = NULL;
    unwindstack(L, L->base);
    if (G(L)->panic)
      G(L)->panic(L);
    exit(EXIT_FAILURE);
  }
  return L;  /* Anything non-NULL will do. */
}